

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

bool __thiscall
slang::parsing::Preprocessor::expandMacro
          (Preprocessor *this,MacroDef macro,MacroExpansion *expansion,
          MacroActualArgumentListSyntax *actualArgs)

{
  long lVar1;
  group_type_pointer pgVar2;
  MacroFormalArgumentListSyntax *pMVar3;
  SourceManager *this_00;
  size_t sVar4;
  BumpAllocator *pBVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  uint uVar7;
  Token TVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined4 uVar14;
  string_view rawText;
  Token token_00;
  ulong uVar15;
  arrays_type *paVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  Preprocessor *pPVar33;
  pointer __n;
  value_type_pointer ppVar34;
  MacroExpansion *pMVar35;
  value_type_pointer ppVar36;
  long lVar37;
  arrays_type *paVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  bool bVar55;
  bool bVar56;
  char cVar57;
  int iVar58;
  SourceLocation SVar59;
  Info *pIVar60;
  Info *pIVar61;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar62;
  uint64_t hash;
  uint uVar63;
  ulong uVar64;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  arrays_type *arrays_;
  MacroActualArgumentListSyntax *pMVar65;
  DefineDirectiveSyntax *pDVar66;
  group_type_pointer pgVar67;
  ulong uVar68;
  arrays_type *args_2;
  arrays_type *paVar69;
  ulong uVar70;
  Token *pTVar71;
  SourceLocation SVar72;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar73;
  pointer pTVar74;
  ulong uVar75;
  Token *pTVar76;
  undefined1 auVar77 [16];
  uchar uVar78;
  uchar uVar79;
  uchar uVar80;
  uchar uVar81;
  uchar uVar82;
  uchar uVar83;
  uchar uVar84;
  uchar uVar85;
  uchar uVar86;
  uchar uVar87;
  uchar uVar88;
  uchar uVar89;
  uchar uVar90;
  uchar uVar91;
  uchar uVar92;
  uchar uVar93;
  string_view rawText_00;
  string_view macroName;
  string_view macroName_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view sVar94;
  SourceRange SVar95;
  Token TVar96;
  bool inDefineDirective;
  Token token;
  Token empty;
  SourceRange expansionRange;
  string_view name;
  value_type *elements;
  SourceLocation start;
  Token endOfArgs;
  anon_class_64_8_ed10e8cd handleToken;
  SourceLocation start_1;
  SourceLocation expansionLoc;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  argumentMap;
  anon_class_32_4_0a8075ed append;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined1 in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc01;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffc08;
  TriviaKind local_3ea;
  TriviaKind local_3e9;
  Preprocessor *local_3e8;
  MacroActualArgumentListSyntax *local_3e0;
  Token local_3d8;
  char *local_3c8;
  value_type_pointer local_3c0;
  uint64_t local_3b8;
  arrays_type *local_3b0;
  DefineDirectiveSyntax *local_3a8;
  Token local_3a0;
  SourceRange local_390;
  SmallVectorBase<slang::parsing::Trivia> local_380;
  long local_348;
  ulong local_340;
  arrays_type *local_338;
  ulong local_330;
  ulong local_328;
  group_type_pointer local_320;
  value_type_pointer local_318;
  MacroExpansion *local_310;
  size_t local_308;
  char *local_300;
  SourceLocation local_2f8;
  Token local_2f0;
  anon_class_64_8_ed10e8cd local_2e0;
  undefined8 local_2a0;
  char *pcStack_298;
  undefined1 local_290 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *local_280;
  undefined1 local_278 [128];
  uchar local_1f8;
  uchar uStack_1f7;
  uchar uStack_1f6;
  uchar uStack_1f5;
  uchar uStack_1f4;
  uchar uStack_1f3;
  uchar uStack_1f2;
  uchar uStack_1f1;
  uchar uStack_1f0;
  uchar uStack_1ef;
  uchar uStack_1ee;
  uchar uStack_1ed;
  uchar uStack_1ec;
  uchar uStack_1eb;
  uchar uStack_1ea;
  uchar uStack_1e9;
  SourceLocation local_1e0;
  undefined1 local_1d8 [328];
  undefined1 local_90 [32];
  value_type_pointer ppStack_70;
  ulong local_68;
  ulong local_60;
  anon_class_32_4_0a8075ed local_50;
  undefined6 uVar11;
  undefined5 uVar13;
  
  pDVar66 = macro.syntax;
  if (macro.intrinsic == None) {
    bVar55 = true;
    if ((pDVar66->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
        _M_extent_value != 0) {
      local_3e0 = actualArgs;
      sVar94 = Token::valueText(&pDVar66->name);
      local_3c8 = sVar94._M_str;
      local_308 = sVar94._M_len;
      pMVar3 = pDVar66->formalArguments;
      if (pMVar3 == (MacroFormalArgumentListSyntax *)0x0) {
        SVar59 = Token::location((pDVar66->body).
                                 super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
        local_290._0_8_ = SVar59;
        this_00 = this->sourceManager;
        SVar95 = MacroExpansion::getRange(expansion);
        macroName._M_str = local_3c8;
        macroName._M_len = local_308;
        local_2e0.inDefineDirective =
             (bool *)SourceManager::createExpansionLoc(this_00,SVar59,SVar95,macroName);
        sVar4 = (pDVar66->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
                _M_extent_value;
        if (sVar4 != 0) {
          pTVar76 = (pDVar66->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr
          ;
          pTVar71 = pTVar76 + sVar4;
          do {
            TVar8 = *pTVar76;
            TVar96 = *pTVar76;
            local_1d8._0_16_ = (undefined1  [16])MacroExpansion::getRange(expansion);
            SVar59 = MacroExpansion::adjustLoc
                               (expansion,TVar96,(SourceLocation *)&local_2e0,
                                (SourceLocation *)local_290,(SourceRange)local_1d8._0_16_);
            MacroExpansion::append(expansion,TVar8,SVar59,false);
            pTVar76 = pTVar76 + 1;
          } while (pTVar76 != pTVar71);
        }
      }
      else {
        local_3a8 = pDVar66;
        if ((pMVar3->args).elements._M_extent._M_extent_value + 1 >> 1 <
            (local_3e0->args).elements._M_extent._M_extent_value + 1 >> 1) {
          local_1d8._0_16_ =
               (undefined1  [16])syntax::SyntaxNode::getFirstToken(&local_3e0->super_SyntaxNode);
          SVar59 = Token::location((Token *)local_1d8);
          addDiag(this,(DiagCode)0x160004,SVar59);
          bVar55 = false;
        }
        else {
          local_1d8._320_8_ = local_1d8;
          local_90._8_8_ = 0x3f;
          local_90._16_8_ = 1;
          stack0xffffffffffffff88 = ZEXT816(0x258290);
          local_68 = 0;
          local_60 = 0;
          local_3e8 = this;
          local_310 = expansion;
          local_90._0_8_ = local_1d8._320_8_;
          if (1 < (pMVar3->args).elements._M_extent._M_extent_value + 1) {
            uVar75 = 0;
            do {
              local_3c8 = sVar94._M_str;
              local_308 = sVar94._M_len;
              ppSVar62 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((pMVar3->args).elements._M_ptr + uVar75 * 2));
              pSVar6 = *ppSVar62;
              if (uVar75 < (local_3e0->args).elements._M_extent._M_extent_value + 1 >> 1) {
                ppSVar62 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       *)((local_3e0->args).elements._M_ptr + uVar75 * 2));
                pSVar73 = *ppSVar62 + 1;
                if ((*(long *)(*ppSVar62 + 3) == 0) && (pSVar6[1].previewNode != (SyntaxNode *)0x0))
                {
                  pSVar73 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
                            &pSVar6[1].previewNode[1].previewNode;
                }
              }
              else {
                if (pSVar6[1].previewNode == (SyntaxNode *)0x0) {
                  SVar59 = Token::location(&local_3e0->closeParen);
                  addDiag(local_3e8,(DiagCode)0x140004,SVar59);
                  bVar55 = false;
                  goto LAB_0020d468;
                }
                pSVar73 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
                          &pSVar6[1].previewNode[1].previewNode;
              }
              local_380._0_16_ = Token::valueText((Token *)(pSVar6 + 1));
              if (local_380.data_ != 0) {
                local_2e0.inDefineDirective = (bool *)pSVar73[1].previewNode;
                local_2e0.append = *(anon_class_32_4_0a8075ed **)(pSVar73 + 2);
                local_2e0.argumentMap =
                     (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                      *)((ulong)local_2e0.argumentMap & 0xffffffffffffff00);
                hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)local_90,
                                  (basic_string_view<char,_std::char_traits<char>_> *)&local_380);
                arrays_ = (arrays_type *)(hash >> (local_90[8] & 0x3f));
                lVar1 = (hash & 0xff) * 4;
                uVar78 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word[lVar1 + 0xc];
                uVar79 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word[lVar1 + 0xd];
                uVar80 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word[lVar1 + 0xe];
                uVar81 = boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word[lVar1 + 0xf];
                local_318 = ppStack_70;
                __n = local_380.data_;
                local_300 = (char *)local_380.len;
                uVar64 = (ulong)((uint)hash & 7);
                uVar70 = 0;
                pgVar67 = (group_type_pointer)local_90._24_8_;
                uVar68 = local_90._16_8_;
                paVar69 = arrays_;
                uVar82 = uVar78;
                uVar83 = uVar79;
                uVar84 = uVar80;
                uVar85 = uVar81;
                uVar86 = uVar78;
                uVar87 = uVar79;
                uVar88 = uVar80;
                uVar89 = uVar81;
                uVar90 = uVar78;
                uVar91 = uVar79;
                uVar92 = uVar80;
                uVar93 = uVar81;
                do {
                  ppVar34 = local_318;
                  pgVar2 = pgVar67 + (long)paVar69;
                  auVar77[0] = -(pgVar2->m[0].n == uVar78);
                  auVar77[1] = -(pgVar2->m[1].n == uVar79);
                  auVar77[2] = -(pgVar2->m[2].n == uVar80);
                  auVar77[3] = -(pgVar2->m[3].n == uVar81);
                  auVar77[4] = -(pgVar2->m[4].n == uVar82);
                  auVar77[5] = -(pgVar2->m[5].n == uVar83);
                  auVar77[6] = -(pgVar2->m[6].n == uVar84);
                  auVar77[7] = -(pgVar2->m[7].n == uVar85);
                  auVar77[8] = -(pgVar2->m[8].n == uVar86);
                  auVar77[9] = -(pgVar2->m[9].n == uVar87);
                  auVar77[10] = -(pgVar2->m[10].n == uVar88);
                  auVar77[0xb] = -(pgVar2->m[0xb].n == uVar89);
                  auVar77[0xc] = -(pgVar2->m[0xc].n == uVar90);
                  auVar77[0xd] = -(pgVar2->m[0xd].n == uVar91);
                  auVar77[0xe] = -(pgVar2->m[0xe].n == uVar92);
                  auVar77[0xf] = -(pgVar2->m[0xf].n == uVar93);
                  lVar37 = (long)paVar69 * 0x10;
                  args_2 = paVar69;
                  paVar38 = paVar69;
                  uVar39 = uVar78;
                  uVar40 = uVar79;
                  uVar41 = uVar80;
                  uVar42 = uVar81;
                  uVar43 = uVar82;
                  uVar44 = uVar83;
                  uVar45 = uVar84;
                  uVar46 = uVar85;
                  uVar47 = uVar86;
                  uVar48 = uVar87;
                  uVar49 = uVar88;
                  uVar50 = uVar89;
                  uVar51 = uVar90;
                  uVar52 = uVar91;
                  uVar53 = uVar92;
                  uVar54 = uVar93;
                  lVar1 = local_348;
                  uVar15 = local_340;
                  paVar16 = local_338;
                  uVar17 = local_1f8;
                  uVar18 = uStack_1f7;
                  uVar19 = uStack_1f6;
                  uVar20 = uStack_1f5;
                  uVar21 = uStack_1f4;
                  uVar22 = uStack_1f3;
                  uVar23 = uStack_1f2;
                  uVar24 = uStack_1f1;
                  uVar25 = uStack_1f0;
                  uVar26 = uStack_1ef;
                  uVar27 = uStack_1ee;
                  uVar28 = uStack_1ed;
                  uVar29 = uStack_1ec;
                  uVar30 = uStack_1eb;
                  uVar31 = uStack_1ea;
                  uVar32 = uStack_1e9;
                  for (uVar63 = (uint)(ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe);
                      uStack_1e9 = uVar54, uStack_1ea = uVar53, uStack_1eb = uVar52,
                      uStack_1ec = uVar51, uStack_1ed = uVar50, uStack_1ee = uVar49,
                      uStack_1ef = uVar48, uStack_1f0 = uVar47, uStack_1f1 = uVar46,
                      uStack_1f2 = uVar45, uStack_1f3 = uVar44, uStack_1f4 = uVar43,
                      uStack_1f5 = uVar42, uStack_1f6 = uVar41, uStack_1f7 = uVar40,
                      local_1f8 = uVar39, local_340 = uVar70, local_338 = paVar38,
                      local_348 = lVar37, uVar63 != 0; uVar63 = uVar63 - 1 & uVar63) {
                    uVar7 = 0;
                    if (uVar63 != 0) {
                      for (; (uVar63 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                      }
                    }
                    ppVar36 = ppVar34 + (long)paVar69 * 0xf + (ulong)uVar7;
                    bVar55 = __n == (pointer)(ppVar36->first)._M_len;
                    local_3b8 = hash;
                    local_3b0 = arrays_;
                    local_330 = uVar68;
                    local_328 = uVar64;
                    local_320 = pgVar67;
                    if (bVar55 && __n != (pointer)0x0) {
                      iVar58 = bcmp(local_300,(ppVar36->first)._M_str,(size_t)__n);
                      bVar55 = iVar58 == 0;
                      uVar78 = local_1f8;
                      uVar79 = uStack_1f7;
                      uVar80 = uStack_1f6;
                      uVar81 = uStack_1f5;
                      uVar82 = uStack_1f4;
                      uVar83 = uStack_1f3;
                      uVar84 = uStack_1f2;
                      uVar85 = uStack_1f1;
                      uVar86 = uStack_1f0;
                      uVar87 = uStack_1ef;
                      uVar88 = uStack_1ee;
                      uVar89 = uStack_1ed;
                      uVar90 = uStack_1ec;
                      uVar91 = uStack_1eb;
                      uVar92 = uStack_1ea;
                      uVar93 = uStack_1e9;
                    }
                    arrays_ = local_3b0;
                    hash = local_3b8;
                    if (bVar55) goto LAB_0020d3c7;
                    lVar37 = local_348;
                    uVar64 = local_328;
                    pgVar67 = local_320;
                    uVar68 = local_330;
                    paVar38 = local_338;
                    uVar70 = local_340;
                    uVar39 = local_1f8;
                    uVar40 = uStack_1f7;
                    uVar41 = uStack_1f6;
                    uVar42 = uStack_1f5;
                    uVar43 = uStack_1f4;
                    uVar44 = uStack_1f3;
                    uVar45 = uStack_1f2;
                    uVar46 = uStack_1f1;
                    uVar47 = uStack_1f0;
                    uVar48 = uStack_1ef;
                    uVar49 = uStack_1ee;
                    uVar50 = uStack_1ed;
                    uVar51 = uStack_1ec;
                    uVar52 = uStack_1eb;
                    uVar53 = uStack_1ea;
                    uVar54 = uStack_1e9;
                    lVar1 = local_348;
                    uVar15 = local_340;
                    paVar16 = local_338;
                    uVar17 = local_1f8;
                    uVar18 = uStack_1f7;
                    uVar19 = uStack_1f6;
                    uVar20 = uStack_1f5;
                    uVar21 = uStack_1f4;
                    uVar22 = uStack_1f3;
                    uVar23 = uStack_1f2;
                    uVar24 = uStack_1f1;
                    uVar25 = uStack_1f0;
                    uVar26 = uStack_1ef;
                    uVar27 = uStack_1ee;
                    uVar28 = uStack_1ed;
                    uVar29 = uStack_1ec;
                    uVar30 = uStack_1eb;
                    uVar31 = uStack_1ea;
                    uVar32 = uStack_1e9;
                  }
                  args_2 = local_338;
                  local_1f8 = uVar17;
                  uStack_1f7 = uVar18;
                  uStack_1f6 = uVar19;
                  uStack_1f5 = uVar20;
                  uStack_1f4 = uVar21;
                  uStack_1f3 = uVar22;
                  uStack_1f2 = uVar23;
                  uStack_1f1 = uVar24;
                  uStack_1f0 = uVar25;
                  uStack_1ef = uVar26;
                  uStack_1ee = uVar27;
                  uStack_1ed = uVar28;
                  uStack_1ec = uVar29;
                  uStack_1eb = uVar30;
                  uStack_1ea = uVar31;
                  uStack_1e9 = uVar32;
                  if ((((slot_type *)((long)pgVar67 + 0xf))[local_348].n &
                      *(byte *)((long)&boost::unordered::detail::foa::
                                       group15<boost::unordered::detail::foa::plain_integral>::
                                       is_not_overflowed(unsigned_long)::shift + uVar64)) == 0)
                  break;
                  uVar70 = local_340 + 1;
                  paVar69 = (arrays_type *)((long)((long)local_338 + 1U) + local_340 & uVar68);
                  args_2 = paVar69;
                  local_348 = lVar1;
                  local_340 = uVar15;
                  local_338 = paVar16;
                } while (uVar70 <= uVar68);
                local_3c0 = (value_type_pointer)0x0;
                ppVar36 = local_3c0;
                local_348 = lVar1;
                local_340 = uVar15;
                local_338 = paVar16;
LAB_0020d3c7:
                local_3c0 = ppVar36;
                if (local_3c0 == (value_type_pointer)0x0) {
                  if (local_60 < local_68) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                    ::
                    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                              ((locator *)local_290,local_90 + 8,arrays_,hash,(size_t)&local_380,
                               (try_emplace_args_t *)&local_2e0,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                               (ArgTokens *)
                               CONCAT71(in_stack_fffffffffffffc01,in_stack_fffffffffffffc00));
                    local_60 = local_60 + 1;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                              ((locator *)local_290,local_90,hash,(try_emplace_args_t *)&local_380,
                               (basic_string_view<char,_std::char_traits<char>_> *)&local_2e0,
                               (ArgTokens *)args_2);
                  }
                }
              }
              sVar94._M_str = local_3c8;
              sVar94._M_len = local_308;
              uVar75 = uVar75 + 1;
            } while (uVar75 < (pMVar3->args).elements._M_extent._M_extent_value + 1 >> 1);
          }
          local_3c8 = sVar94._M_str;
          local_308 = sVar94._M_len;
          local_2f0 = syntax::SyntaxNode::getLastToken(&local_3e0->super_SyntaxNode);
          pMVar35 = local_310;
          SVar95 = MacroExpansion::getRange(local_310);
          sVar4 = local_308;
          SVar59 = Token::location(&local_2f0);
          pPVar33 = local_3e8;
          sVar94 = Token::rawText(&local_2f0);
          local_390.endLoc = (SourceLocation)(sVar94._M_len * 0x10000000 + (long)SVar59);
          local_390.startLoc = SVar95.startLoc;
          local_2f8 = Token::location((local_3a8->body).
                                      super_span<slang::parsing::Token,_18446744073709551615UL>.
                                      _M_ptr);
          SVar95.endLoc = local_390.endLoc;
          SVar95.startLoc = local_390.startLoc;
          macroName_00._M_str = local_3c8;
          macroName_00._M_len = sVar4;
          local_1e0 = SourceManager::createExpansionLoc
                                (pPVar33->sourceManager,local_2f8,SVar95,macroName_00);
          local_2e0.expansionLoc = &local_1e0;
          local_2e0.append = &local_50;
          local_50.expansion = pMVar35;
          local_2e0.start = &local_2f8;
          local_2e0.expansionRange = &local_390;
          local_2e0.inDefineDirective = (bool *)&local_3e9;
          local_3e9 = 0;
          local_2e0.argumentMap =
               (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                *)local_1d8;
          local_2e0.this = pPVar33;
          local_2e0.expansion = pMVar35;
          sVar4 = (local_3a8->body).super_span<slang::parsing::Token,_18446744073709551615UL>.
                  _M_extent._M_extent_value;
          local_50.expansionLoc = local_2e0.expansionLoc;
          local_50.start = local_2e0.start;
          local_50.expansionRange = local_2e0.expansionRange;
          if (sVar4 == 0) {
            bVar55 = true;
          }
          else {
            pTVar74 = (local_3a8->body).super_span<slang::parsing::Token,_18446744073709551615UL>.
                      _M_ptr;
            pMVar65 = (MacroActualArgumentListSyntax *)(pTVar74 + sVar4);
            local_3e0 = pMVar65;
            do {
              uVar9 = pTVar74->kind;
              uVar10 = pTVar74->field_0x2;
              uVar12 = pTVar74->numFlags;
              uVar14 = pTVar74->rawLen;
              uVar13 = CONCAT41(uVar14,uVar12);
              uVar11 = CONCAT51(uVar13,uVar10);
              local_3d8.info = pTVar74->info;
              local_3d8.kind = uVar9;
              local_3d8._2_6_ = uVar11;
              if (((uVar9 == Identifier) &&
                  (sVar94 = Token::rawText(&local_3d8), sVar94._M_len != 0)) &&
                 (sVar94 = Token::rawText(&local_3d8), *sVar94._M_str == '\\')) {
                local_290 = (undefined1  [16])Token::rawText(&local_3d8);
                cVar57 = '\0';
                pIVar60 = (Info *)std::basic_string_view<char,_std::char_traits<char>_>::find
                                            ((basic_string_view<char,_std::char_traits<char>_> *)
                                             local_290,"``",0,2);
                if (pIVar60 != (Info *)0xffffffffffffffff) {
                  pBVar5 = local_3e8->alloc;
                  sVar94 = Token::rawText(&local_3d8);
                  pIVar61 = (Info *)sVar94._M_len;
                  if (pIVar60 <= (Info *)sVar94._M_len) {
                    pIVar61 = pIVar60;
                  }
                  rawText_00._M_str = sVar94._M_str;
                  rawText_00._M_len = (size_t)pIVar61;
                  TVar96 = Token::withRawText(&local_3d8,pBVar5,rawText_00);
                  bVar55 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_2e0,TVar96);
                  cVar57 = '\x01';
                  if (bVar55) {
                    local_290._8_8_ = 0;
                    local_290._0_8_ = local_278;
                    local_280 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>
                                 *)0x8;
                    TVar96.info = pIVar60;
                    TVar96._0_8_ = local_3d8.info;
                    Lexer::splitTokens((Lexer *)local_3e8->alloc,
                                       (BumpAllocator *)local_3e8->diagnostics,
                                       (Diagnostics *)local_3e8->sourceManager,
                                       (SourceManager *)CONCAT62(local_3d8._2_6_,local_3d8.kind),
                                       TVar96,CONCAT44(in_stack_fffffffffffffbfc,
                                                       (uint)(local_3e8->keywordVersionStack).
                                                                                                                          
                                                  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1]),
                                       (KeywordVersion)local_290,in_stack_fffffffffffffc08);
                    cVar57 = '\x0f';
                    bVar55 = (char *)local_290._8_8_ == (char *)0x0;
                    if (!bVar55) {
                      SVar72 = (SourceLocation)(local_290._8_8_ * 0x10 + local_290._0_8_);
                      SVar59 = (SourceLocation)local_290._0_8_;
                      do {
                        bVar56 = expandMacro::anon_class_64_8_ed10e8cd::operator()
                                           (&local_2e0,*(Token *)SVar59);
                        if (!bVar56) {
                          cVar57 = '\x01';
                          break;
                        }
                        SVar59 = (SourceLocation)((long)SVar59 + 0x10);
                        bVar55 = SVar59 == SVar72;
                      } while (!bVar55);
                    }
                    if (bVar55) {
                      if ((char *)local_290._8_8_ != (char *)0x0) {
                        local_380.len = 0;
                        local_380.data_ = (pointer)local_380.firstElement;
                        local_380.cap = 2;
                        local_3ea = Whitespace;
                        local_3a0.kind = EndOfFile;
                        local_3a0._2_1_ = 0;
                        local_3a0.numFlags.raw = '\0';
                        local_3a0.rawLen = 0;
                        local_3a0.info = (Info *)0x28a44e;
                        SmallVectorBase<slang::parsing::Trivia>::
                        emplace_back<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
                                  (&local_380,&local_3ea,
                                   (basic_string_view<char,_std::char_traits<char>_> *)&local_3a0);
                        SVar59 = Token::location((Token *)(local_290._0_8_ + local_290._8_8_ * 0x10
                                                          + -0x10));
                        sVar94 = Token::rawText((Token *)(local_290._0_8_ + local_290._8_8_ * 0x10 +
                                                         -0x10));
                        pBVar5 = local_3e8->alloc;
                        iVar58 = SmallVectorBase<slang::parsing::Trivia>::copy
                                           (&local_380,(EVP_PKEY_CTX *)pBVar5,
                                            (EVP_PKEY_CTX *)sVar94._M_str);
                        trivia._M_ptr._4_4_ = extraout_var;
                        trivia._M_ptr._0_4_ = iVar58;
                        local_2a0 = 0;
                        pcStack_298 = "";
                        in_stack_fffffffffffffbfc = 0;
                        rawText._M_str._1_7_ = 0x2697;
                        rawText._0_9_ = (unkuint9)0xce << 0x40;
                        trivia._M_extent._M_extent_value = extraout_RDX._M_extent_value;
                        Token::Token(&local_3a0,pBVar5,EmptyMacroArgument,trivia,rawText,
                                     (SourceLocation)(sVar94._M_len * 0x10000000 + (long)SVar59));
                        TVar8.info = local_3a0.info;
                        TVar8.kind = local_3a0.kind;
                        TVar8._2_1_ = local_3a0._2_1_;
                        TVar8.numFlags.raw = local_3a0.numFlags.raw;
                        TVar8.rawLen = local_3a0.rawLen;
                        bVar55 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_2e0,TVar8)
                        ;
                        if (local_380.data_ != (pointer)local_380.firstElement) {
                          operator_delete(local_380.data_);
                        }
                        cVar57 = '\x01';
                        if (!bVar55) goto LAB_0020d0cd;
                      }
                      cVar57 = '\x0e';
                    }
LAB_0020d0cd:
                    if ((undefined1 *)local_290._0_8_ != local_278) {
                      operator_delete((void *)local_290._0_8_);
                    }
                  }
                }
                pMVar65 = local_3e0;
                if (cVar57 == '\0') goto LAB_0020d0ee;
              }
              else {
LAB_0020d0ee:
                token_00._2_1_ = local_3d8._2_1_;
                token_00.numFlags.raw = local_3d8.numFlags.raw;
                token_00.rawLen = local_3d8.rawLen;
                token_00.kind = local_3d8.kind;
                token_00.info = local_3d8.info;
                bVar55 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_2e0,token_00);
                cVar57 = !bVar55;
              }
              if ((cVar57 != '\x0e') && (cVar57 != '\0')) goto LAB_0020d124;
              pTVar74 = pTVar74 + 1;
            } while ((MacroActualArgumentListSyntax *)pTVar74 != pMVar65);
            cVar57 = '\r';
LAB_0020d124:
            bVar55 = cVar57 == '\r';
          }
LAB_0020d468:
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
          ::delete_arrays((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                           *)local_90,(arrays_type *)(local_90 + 8));
        }
      }
    }
  }
  else {
    expandIntrinsic(this,macro.intrinsic,expansion);
    bVar55 = true;
  }
  return bVar55;
}

Assistant:

bool Preprocessor::expandMacro(MacroDef macro, MacroExpansion& expansion,
                               MacroActualArgumentListSyntax* actualArgs) {
    if (macro.isIntrinsic()) {
        // for now, no intrisics can have arguments
        SLANG_ASSERT(!actualArgs);
        return expandIntrinsic(macro.intrinsic, expansion);
    }

    const DefineDirectiveSyntax* directive = macro.syntax;
    SLANG_ASSERT(directive);

    // ignore empty macro
    const auto& body = directive->body;
    if (body.empty())
        return true;

    std::string_view macroName = directive->name.valueText();

    if (!directive->formalArguments) {
        // each macro expansion gets its own location entry
        SourceLocation start = body[0].location();
        SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansion.getRange(),
                                                                       macroName);

        // simple macro; just take body tokens
        for (auto token : body)
            expansion.append(token, expansionLoc, start, expansion.getRange());

        return true;
    }

    // match up actual arguments with formal parameters
    SLANG_ASSERT(actualArgs);
    auto& formalList = directive->formalArguments->args;
    auto& actualList = actualArgs->args;
    if (actualList.size() > formalList.size()) {
        addDiag(diag::TooManyActualMacroArgs, actualArgs->getFirstToken().location());
        return false;
    }

    struct ArgTokens : public std::span<const Token> {
        using std::span<const Token>::span;
        using std::span<const Token>::operator=;
        bool isExpanded = false;
    };
    SmallMap<std::string_view, ArgTokens, 8> argumentMap;

    for (size_t i = 0; i < formalList.size(); i++) {
        auto formal = formalList[i];
        const TokenList* tokenList = nullptr;
        if (actualList.size() > i) {
            // if our actual argument is empty and we have a default, take that
            tokenList = &actualList[i]->tokens;
            if (tokenList->empty() && formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
        }
        else {
            // if we've run out of actual args make sure we have a default for this one
            if (formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
            else {
                addDiag(diag::NotEnoughMacroArgs, actualArgs->closeParen.location());
                return false;
            }
        }

        auto name = formal->name.valueText();
        if (!name.empty())
            argumentMap.emplace(name, ArgTokens(*tokenList));
    }

    Token endOfArgs = actualArgs->getLastToken();
    SourceRange expansionRange(expansion.getRange().start(),
                               endOfArgs.location() + endOfArgs.rawText().length());

    SourceLocation start = body[0].location();
    SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansionRange,
                                                                   macroName);

    auto append = [&](Token token) {
        expansion.append(token, expansionLoc, start, expansionRange);
        return true;
    };

    bool inDefineDirective = false;

    auto handleToken = [&](Token token) {
        if (inDefineDirective && !token.isOnSameLine())
            inDefineDirective = false;

        if (token.kind != TokenKind::Identifier && !LF::isKeyword(token.kind) &&
            token.kind != TokenKind::Directive) {
            // Non-identifier, can't be argument substituted.
            return append(token);
        }

        std::string_view text = token.valueText();
        if (token.kind == TokenKind::Directive && !text.empty()) {
            if (token.directiveKind() != SyntaxKind::MacroUsage) {
                // If this is the start of a `define directive, note that fact because
                // during argument expansion we will insert line continuations.
                if (token.directiveKind() == SyntaxKind::DefineDirective)
                    inDefineDirective = true;
                return append(token);
            }

            // Other tools allow arguments to replace matching directive names, e.g.:
            // `define FOO(bar) `bar
            // `define ONE 1
            // `FOO(ONE)   // expands to 1
            text = text.substr(1);
        }

        // check for formal param
        auto it = argumentMap.find(text);
        if (it == argumentMap.end())
            return append(token);

        // Fully expand out arguments before substitution to make sure we can detect whether
        // a usage of a macro in a replacement list is valid or an illegal recursion.
        if (!it->second.isExpanded) {
            std::span<const Token> argTokens = it->second;
            SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
            if (!expandReplacementList(argTokens, alreadyExpanded))
                return false;

            it->second = argTokens;
            it->second.isExpanded = true;
        }

        auto begin = it->second.begin();
        auto end = it->second.end();
        if (begin == end) {
            // The macro argument contained no tokens. We still need to supply an empty token
            // here to ensure that the trivia of the formal parameter is passed on.
            Token empty(alloc, TokenKind::EmptyMacroArgument, token.trivia(), ""sv,
                        token.location());
            return append(empty);
        }

        // We need to ensure that we get correct spacing for the leading token here;
        // it needs to come from the *formal* parameter used in the macro body, not
        // from the argument itself.
        Token first = begin->withTrivia(alloc, token.trivia());
        SourceLocation firstLoc = first.location();

        // Arguments need their own expansion location created; the original
        // location comes from the source file itself, and the expansion location
        // points into the macro body where the formal argument was used.
        SourceLocation tokenLoc = expansion.adjustLoc(token, expansionLoc, start, expansionRange);
        SourceRange argRange(tokenLoc, tokenLoc + token.rawText().length());
        SourceLocation argLoc = sourceManager.createExpansionLoc(firstLoc, argRange, true);

        // See note above about weird macro usage being argument replaced.
        // In that case we want to fabricate the correct directive token here.
        if (token.kind == TokenKind::Directive) {
            Token grave(alloc, TokenKind::Unknown, first.trivia(), "`"sv, firstLoc);
            Token combined = Lexer::concatenateTokens(alloc, sourceManager, grave, first);
            if (combined) {
                first = combined;
            }
            else {
                // Failed to combine, so ignore the grave and issue an error.
                addDiag(diag::MisplacedDirectiveChar, firstLoc);
            }
        }

        if (inDefineDirective) {
            // Inside a define directive we need to insert line continuations
            // any time an expanded token will end up on a new line.
            auto appendBody = [&](Token token) {
                if (!token.isOnSameLine()) {
                    Token lc(alloc, TokenKind::LineContinuation, token.trivia(), "\\"sv,
                             token.location());
                    expansion.append(lc, argLoc, firstLoc, argRange,
                                     /* allowLineContinuation */ true);

                    token = token.withTrivia(alloc, {});
                }
                expansion.append(token, argLoc, firstLoc, argRange);
            };

            appendBody(first);
            for (++begin; begin != end; begin++)
                appendBody(*begin);
        }
        else {
            expansion.append(first, argLoc, firstLoc, argRange);
            for (++begin; begin != end; begin++)
                expansion.append(*begin, argLoc, firstLoc, argRange);
        }

        return true;
    };

    // Now add each body token, substituting arguments as necessary.
    for (auto token : body) {
        if (token.kind == TokenKind::Identifier && !token.rawText().empty() &&
            token.rawText()[0] == '\\') {
            // Escaped identifier, might need to break apart and substitute
            // individual pieces of it.
            size_t index = token.rawText().find("``");
            if (index != std::string_view::npos) {
                Token first = token.withRawText(alloc, token.rawText().substr(0, index));
                if (!handleToken(first))
                    return false;

                SmallVector<Token, 8> splits;
                splitTokens(token, index, splits);
                for (auto t : splits) {
                    if (!handleToken(t))
                        return false;
                }

                // Add an empty argument in here so we can make sure a space ends
                // the escaped identifier once it gets concatenated again.
                if (!splits.empty()) {
                    SmallVector<Trivia> triviaBuf;
                    triviaBuf.emplace_back(TriviaKind::Whitespace, " "sv);

                    auto loc = splits.back().location() + splits.back().rawText().length();
                    Token empty(alloc, TokenKind::EmptyMacroArgument, triviaBuf.copy(alloc), ""sv,
                                loc);

                    if (!handleToken(empty))
                        return false;
                }

                continue;
            }
        }

        if (!handleToken(token))
            return false;
    }

    return true;
}